

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

void __thiscall
TPZSkylMatrix<std::complex<long_double>_>::SolveSOR
          (TPZSkylMatrix<std::complex<long_double>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<long_double>_> *F,TPZFMatrix<std::complex<long_double>_> *result,
          TPZFMatrix<std::complex<long_double>_> *residual,
          TPZFMatrix<std::complex<long_double>_> *scratch,REAL overrelax,REAL *tol,int FromCurrent,
          int direction)

{
  double dVar1;
  complex<long_double> **ppcVar2;
  complex<long_double> *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  undefined4 extraout_var;
  long lVar9;
  long lVar10;
  long lVar11;
  complex<long_double> *pcVar12;
  undefined *puVar13;
  complex<long_double> *pcVar14;
  complex<long_double> *pcVar15;
  undefined1 *puVar16;
  long lVar17;
  undefined8 *puVar18;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar19;
  longdouble lVar20;
  longdouble in_ST2;
  longdouble lVar21;
  longdouble lVar22;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  complex<long_double> val;
  complex<long_double> __r;
  complex<long_double> __r_2;
  complex<long_double> over;
  longdouble local_1b8;
  complex<long_double> local_198;
  longdouble local_170;
  TPZSkylMatrix<std::complex<long_double>_> *local_160;
  complex<long_double> local_158;
  complex<long_double> *local_138;
  long local_130;
  double local_128;
  complex<long_double> *local_120;
  complex<long_double> *local_118;
  int local_10c;
  undefined4 local_108;
  undefined2 local_104;
  long local_100;
  complex<long_double> local_f8;
  double *local_d8;
  TPZFMatrix<std::complex<long_double>_> *local_d0;
  long *local_c8;
  complex<long_double> *local_c0;
  int64_t local_b8;
  long local_b0;
  TPZFMatrix<std::complex<long_double>_> *local_a8;
  long local_a0;
  long local_98;
  long local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  complex<long_double> local_58;
  
  local_160 = this;
  local_d0 = F;
  local_c8 = numiterations;
  if (residual == F) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZMatrix::SolveSOR called with residual and F equal, no solution\n",0x42);
    return;
  }
  local_170 = (longdouble)CONCAT28(local_170._8_2_,overrelax);
  local_10c = direction;
  local_d8 = tol;
  local_a8 = residual;
  if (residual == (TPZFMatrix<std::complex<long_double>_> *)0x0) {
    dVar1 = *tol + *tol + 1.0;
  }
  else {
    Dot<std::complex<long_double>>(&local_198,residual,residual);
    sqrtl();
    dVar1 = (double)in_ST0;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    local_60 = dVar1;
  }
  local_1b8 = (longdouble)CONCAT28(local_1b8._8_2_,dVar1);
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(result);
  }
  local_68 = local_170._0_8_;
  local_58._M_value._0_8_ = SUB108((longdouble)local_170._0_8_,0);
  local_58._M_value._8_2_ = SUB102((unkuint10)(longdouble)local_170._0_8_ >> 0x40,0);
  local_58._M_value._16_8_ = SUB108((longdouble)0,0);
  local_58._M_value._24_2_ = SUB102((unkuint10)(longdouble)0 >> 0x40,0);
  iVar8 = (*(local_160->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable[0xc])();
  local_120 = (complex<long_double> *)
              (((complex<long_double> *)CONCAT44(extraout_var,iVar8))[-1]._M_value + 0x1f);
  pcVar15 = (complex<long_double> *)0x0;
  local_138 = pcVar15;
  if (local_10c != -1) {
    local_120 = pcVar15;
    local_138 = (complex<long_double> *)CONCAT44(extraout_var,iVar8);
  }
  if ((0 < *local_c8) && (*local_d8 <= dVar1 && dVar1 != *local_d8)) {
    local_b8 = (local_d0->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
    local_100 = (ulong)(local_10c != -1) * 2 + -1;
    local_a0 = (long)local_120 * 0x20 + 0x30;
    local_98 = local_100 * 0x20;
    pcVar15 = (complex<long_double> *)0x0;
    do {
      local_c0 = pcVar15;
      TPZFMatrix<std::complex<long_double>_>::operator=(scratch,local_d0);
      local_128 = 0.0;
      if (0 < local_b8) {
        local_128 = 0.0;
        local_b0 = 0;
        lVar17 = 0;
        do {
          local_130 = lVar17;
          if (local_10c == 1) {
            local_1b8 = (longdouble)CONCAT28(local_1b8._8_2_,local_a0);
            pcVar15 = local_120;
            if (local_120 != local_138) {
              do {
                ppcVar2 = (local_160->fElem).fStore;
                lVar17 = (long)ppcVar2[(long)(pcVar15->_M_value + 1)] - (long)ppcVar2[(long)pcVar15]
                ;
                local_90 = lVar17 >> 5;
                lVar19 = (longdouble)0;
                local_198._M_value._0_4_ = SUB104(lVar19,0);
                local_198._M_value._4_4_ = SUB104((unkuint10)lVar19 >> 0x20,0);
                local_198._M_value._8_2_ = SUB102((unkuint10)lVar19 >> 0x40,0);
                local_118 = (local_160->fElem).fStore[(long)pcVar15];
                local_198._M_value._16_4_ = local_198._M_value._0_4_;
                local_198._M_value._20_4_ = local_198._M_value._4_4_;
                local_198._M_value._24_2_ = local_198._M_value._8_2_;
                if ((((long)pcVar15 - local_90 < -1) ||
                    ((scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow
                     <= ((long)pcVar15 - local_90) + 1)) ||
                   ((scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                    <= local_130)) {
                  TPZFMatrix<std::complex<long_double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((((long)pcVar15 < 0) ||
                    ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow
                     <= (long)pcVar15)) ||
                   ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                    <= local_130)) {
                  TPZFMatrix<std::complex<long_double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar9 = (result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                        fRow * local_130;
                pcVar3 = result->fElem + (long)(pcVar15->_M_value + lVar9);
                uVar4 = *(undefined8 *)pcVar3->_M_value;
                uVar5 = *(undefined8 *)(pcVar3->_M_value + 8);
                puVar18 = (undefined8 *)
                          (result->fElem[(long)(pcVar15->_M_value + lVar9)]._M_value + 0x10);
                uVar6 = *puVar18;
                uVar7 = puVar18[1];
                local_198._M_value._16_4_ = SUB84(uVar6,0);
                local_198._M_value._20_4_ = SUB84((ulong)uVar6 >> 0x20,0);
                local_198._M_value._24_2_ = SUB82(uVar7,0);
                local_198._M_value._26_2_ = SUB82((ulong)uVar7 >> 0x10,0);
                local_198._M_value._28_2_ = SUB82((ulong)uVar7 >> 0x20,0);
                local_198._M_value._30_2_ = SUB82((ulong)uVar7 >> 0x30,0);
                local_198._M_value._0_4_ = SUB84(uVar4,0);
                local_198._M_value._4_4_ = SUB84((ulong)uVar4 >> 0x20,0);
                local_198._M_value._8_2_ = SUB82(uVar5,0);
                local_198._M_value._10_2_ = SUB82((ulong)uVar5 >> 0x10,0);
                local_198._M_value._12_2_ = SUB82((ulong)uVar5 >> 0x20,0);
                local_198._M_value._14_2_ = SUB82((ulong)uVar5 >> 0x30,0);
                local_170 = (longdouble)CONCAT28(local_170._8_2_,pcVar15);
                puVar18 = (undefined8 *)
                          ((long)(local_160->fElem).fStore[(long)pcVar15] + lVar17 + -0x20);
                lVar17 = (long)puVar18 - (long)local_118 >> 5;
                if (-1 < lVar17) {
                  lVar17 = lVar17 + 1;
                  lVar9 = (scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix
                          .fRow * local_b0 + local_90 * -0x20;
                  puVar13 = scratch->fElem->_M_value + local_1b8._0_8_;
                  do {
                    uVar4 = *puVar18;
                    uVar5 = puVar18[1];
                    local_158._M_value._16_8_ = puVar18[2];
                    uVar6 = puVar18[3];
                    local_158._M_value._24_2_ = SUB82(uVar6,0);
                    local_158._M_value._26_4_ = SUB84((ulong)uVar6 >> 0x10,0);
                    local_158._M_value._30_2_ = SUB82((ulong)uVar6 >> 0x30,0);
                    local_158._M_value._0_4_ = SUB84(uVar4,0);
                    local_158._M_value._4_2_ = SUB82((ulong)uVar4 >> 0x20,0);
                    local_158._M_value._6_2_ = SUB82((ulong)uVar4 >> 0x30,0);
                    local_158._M_value._8_2_ = SUB82(uVar5,0);
                    local_158._M_value._10_4_ = SUB84((ulong)uVar5 >> 0x10,0);
                    local_158._M_value._14_2_ = SUB82((ulong)uVar5 >> 0x30,0);
                    std::complex<long_double>::operator*=(&local_158,&local_198);
                    *(longdouble *)(puVar13 + lVar9 + -0x10) =
                         *(longdouble *)(puVar13 + lVar9 + -0x10) -
                         (longdouble)
                         CONCAT28(local_158._M_value._8_2_,
                                  CONCAT26(local_158._M_value._6_2_,
                                           CONCAT24(local_158._M_value._4_2_,
                                                    local_158._M_value._0_4_)));
                    *(longdouble *)(puVar13 + lVar9) =
                         *(longdouble *)(puVar13 + lVar9) -
                         (longdouble)CONCAT28(local_158._M_value._24_2_,local_158._M_value._16_8_);
                    puVar13 = puVar13 + 0x20;
                    puVar18 = puVar18 + -4;
                    lVar17 = lVar17 + -1;
                  } while (lVar17 != 0);
                }
                pcVar15 = (complex<long_double> *)((long)local_170._0_8_ + local_100);
                local_1b8 = (longdouble)CONCAT28(local_1b8._8_2_,local_1b8._0_8_ + local_98);
              } while (pcVar15 != local_138);
            }
            pcVar15 = local_120;
            if (local_120 != local_138) {
              do {
                ppcVar2 = (local_160->fElem).fStore;
                lVar17 = (long)ppcVar2[(long)(pcVar15->_M_value + 1)] - (long)ppcVar2[(long)pcVar15]
                ;
                if ((((long)pcVar15 < 0) ||
                    ((scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow
                     <= (long)pcVar15)) ||
                   ((scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                    <= local_130)) {
                  TPZFMatrix<std::complex<long_double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar11 = (scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                         fRow * local_130;
                lVar9 = lVar17 >> 5;
                pcVar3 = scratch->fElem + (long)(pcVar15->_M_value + lVar11);
                uVar4 = *(undefined8 *)pcVar3->_M_value;
                uVar5 = *(undefined8 *)(pcVar3->_M_value + 8);
                puVar18 = (undefined8 *)
                          (scratch->fElem[(long)(pcVar15->_M_value + lVar11)]._M_value + 0x10);
                local_158._M_value._16_8_ = *puVar18;
                uVar6 = puVar18[1];
                local_158._M_value._24_2_ = SUB82(uVar6,0);
                local_158._M_value._26_4_ = SUB84((ulong)uVar6 >> 0x10,0);
                local_158._M_value._30_2_ = SUB82((ulong)uVar6 >> 0x30,0);
                local_158._M_value._0_4_ = SUB84(uVar4,0);
                local_158._M_value._4_2_ = SUB82((ulong)uVar4 >> 0x20,0);
                local_158._M_value._6_2_ = SUB82((ulong)uVar4 >> 0x30,0);
                local_158._M_value._8_2_ = SUB82(uVar5,0);
                local_158._M_value._10_4_ = SUB84((ulong)uVar5 >> 0x10,0);
                local_158._M_value._14_2_ = SUB82((ulong)uVar5 >> 0x30,0);
                puVar16 = (undefined1 *)((long)pcVar15 + (1 - lVar9));
                if ((((long)pcVar15 - lVar9 < -1) ||
                    ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow
                     <= (long)puVar16)) ||
                   ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                    <= local_130)) {
                  TPZFMatrix<std::complex<long_double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pcVar3 = (local_160->fElem).fStore[(long)pcVar15];
                pcVar14 = (complex<long_double> *)((long)pcVar3 + lVar17 + -0x20);
                local_1b8 = in_ST0;
                lVar19 = in_ST1;
                lVar21 = in_ST2;
                if (pcVar3 < pcVar14) {
                  pcVar12 = result->fElem +
                            (long)(puVar16 +
                                  (result->super_TPZMatrix<std::complex<long_double>_>).
                                  super_TPZBaseMatrix.fRow * local_130);
                  do {
                    uVar4 = *(undefined8 *)(pcVar14->_M_value + 8);
                    uVar5 = *(undefined8 *)(pcVar14->_M_value + 0x18);
                    local_198._M_value._16_4_ = SUB84(*(undefined8 *)(pcVar14->_M_value + 0x10),0);
                    local_198._M_value._20_4_ =
                         SUB84((ulong)*(undefined8 *)(pcVar14->_M_value + 0x10) >> 0x20,0);
                    local_198._M_value._24_2_ = SUB82(uVar5,0);
                    local_198._M_value._26_2_ = SUB82((ulong)uVar5 >> 0x10,0);
                    local_198._M_value._28_2_ = SUB82((ulong)uVar5 >> 0x20,0);
                    local_198._M_value._30_2_ = SUB82((ulong)uVar5 >> 0x30,0);
                    local_198._M_value._0_4_ = SUB84(*(undefined8 *)pcVar14->_M_value,0);
                    local_198._M_value._4_4_ =
                         SUB84((ulong)*(undefined8 *)pcVar14->_M_value >> 0x20,0);
                    local_198._M_value._8_2_ = SUB82(uVar4,0);
                    local_198._M_value._10_2_ = SUB82((ulong)uVar4 >> 0x10,0);
                    local_198._M_value._12_2_ = SUB82((ulong)uVar4 >> 0x20,0);
                    local_198._M_value._14_2_ = SUB82((ulong)uVar4 >> 0x30,0);
                    std::complex<long_double>::operator*=(&local_198,pcVar12);
                    lVar21 = (longdouble)
                             CONCAT28(local_158._M_value._8_2_,
                                      CONCAT26(local_158._M_value._6_2_,
                                               CONCAT24(local_158._M_value._4_2_,
                                                        local_158._M_value._0_4_))) -
                             (longdouble)
                             CONCAT28(local_198._M_value._8_2_,
                                      CONCAT44(local_198._M_value._4_4_,local_198._M_value._0_4_));
                    lVar19 = (longdouble)
                             CONCAT28(local_158._M_value._24_2_,local_158._M_value._16_8_) -
                             (longdouble)
                             CONCAT28(local_198._M_value._24_2_,
                                      CONCAT44(local_198._M_value._20_4_,local_198._M_value._16_4_))
                    ;
                    local_158._M_value._0_4_ = SUB104(lVar21,0);
                    local_158._M_value._4_2_ = SUB102((unkuint10)lVar21 >> 0x20,0);
                    local_158._M_value._6_2_ = SUB102((unkuint10)lVar21 >> 0x30,0);
                    local_158._M_value._8_2_ = SUB102((unkuint10)lVar21 >> 0x40,0);
                    local_158._M_value._16_8_ = SUB108(lVar19,0);
                    local_158._M_value._24_2_ = SUB102((unkuint10)lVar19 >> 0x40,0);
                    pcVar14 = pcVar14 + -1;
                    pcVar12 = pcVar12 + 1;
                    local_1b8 = in_ST0;
                    lVar19 = in_ST1;
                    lVar21 = in_ST2;
                  } while (pcVar3 < pcVar14);
                }
                in_ST1 = in_ST4;
                in_ST0 = in_ST3;
                local_f8._M_value._16_8_ = local_158._M_value._16_8_;
                local_f8._M_value._24_2_ = local_158._M_value._24_2_;
                local_f8._M_value._26_6_ =
                     SUB86(CONCAT26(local_158._M_value._30_2_,
                                    CONCAT42(local_158._M_value._26_4_,local_158._M_value._24_2_))
                           >> 0x10,0);
                local_f8._M_value._0_4_ = local_158._M_value._0_4_;
                local_f8._M_value._4_2_ = local_158._M_value._4_2_;
                local_f8._M_value._6_2_ = local_158._M_value._6_2_;
                local_f8._M_value._8_2_ = local_158._M_value._8_2_;
                local_f8._M_value._10_6_ =
                     SUB86(CONCAT26(local_158._M_value._14_2_,
                                    CONCAT42(local_158._M_value._10_4_,local_158._M_value._8_2_)) >>
                           0x10,0);
                std::complex<long_double>::operator*=(&local_f8,&local_158);
                local_198._M_value._0_4_ = local_f8._M_value._0_4_;
                local_198._M_value._4_4_ =
                     SUB84(CONCAT26(local_f8._M_value._6_2_,
                                    CONCAT24(local_f8._M_value._4_2_,local_f8._M_value._0_4_)) >>
                           0x20,0);
                local_198._M_value._8_2_ = local_f8._M_value._8_2_;
                local_198._M_value._16_4_ = local_f8._M_value._16_4_;
                local_198._M_value._20_4_ = local_f8._M_value._20_4_;
                local_198._M_value._24_2_ = local_f8._M_value._24_2_;
                cabsl();
                local_198._M_value._16_4_ = local_158._M_value._16_4_;
                local_198._M_value._20_4_ = local_158._M_value._20_4_;
                local_198._M_value._24_2_ = local_158._M_value._24_2_;
                local_198._M_value._26_2_ = local_158._M_value._26_2_;
                local_198._M_value._28_2_ = local_158._M_value._28_2_;
                local_198._M_value._30_2_ = local_158._M_value._30_2_;
                local_198._M_value._0_4_ = local_158._M_value._0_4_;
                local_198._M_value._4_4_ =
                     SUB84(CONCAT26(local_158._M_value._6_2_,
                                    CONCAT24(local_158._M_value._4_2_,local_158._M_value._0_4_)) >>
                           0x20,0);
                local_198._M_value._8_2_ = local_158._M_value._8_2_;
                local_198._M_value._10_2_ = local_158._M_value._10_2_;
                local_198._M_value._12_2_ = local_158._M_value._12_2_;
                local_198._M_value._14_2_ = local_158._M_value._14_2_;
                std::complex<long_double>::operator*=(&local_198,&local_58);
                in_ST2 = in_ST1;
                in_ST3 = in_ST1;
                __divxc3();
                local_80 = local_128;
                local_128 = (double)(local_1b8 + (longdouble)local_128);
                local_88 = local_128;
                if ((((long)pcVar15 < 0) ||
                    ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow
                     <= (long)pcVar15)) ||
                   ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                    <= local_130)) {
                  TPZFMatrix<std::complex<long_double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar17 = (result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                         fRow * local_130;
                pcVar3 = result->fElem;
                lVar20 = *(longdouble *)(pcVar3[(long)(pcVar15->_M_value + lVar17)]._M_value + 0x10)
                ;
                *(longdouble *)pcVar3[(long)(pcVar15->_M_value + lVar17)]._M_value =
                     lVar19 + *(longdouble *)pcVar3[(long)(pcVar15->_M_value + lVar17)]._M_value;
                *(longdouble *)(pcVar3[(long)(pcVar15->_M_value + lVar17)]._M_value + 0x10) =
                     lVar21 + lVar20;
                pcVar15 = (complex<long_double> *)(pcVar15->_M_value + local_100);
                in_ST4 = in_ST3;
              } while (pcVar15 != local_138);
            }
          }
          else {
            pcVar15 = local_120;
            if (local_120 != local_138) {
              do {
                ppcVar2 = (local_160->fElem).fStore;
                lVar17 = (long)ppcVar2[(long)(pcVar15->_M_value + 1)] - (long)ppcVar2[(long)pcVar15]
                ;
                if ((((long)pcVar15 < 0) ||
                    ((scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow
                     <= (long)pcVar15)) ||
                   ((scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                    <= local_130)) {
                  TPZFMatrix<std::complex<long_double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar9 = lVar17 >> 5;
                lVar11 = (scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                         fRow * local_130;
                pcVar3 = scratch->fElem;
                lVar19 = *(longdouble *)pcVar3[(long)(pcVar15->_M_value + lVar11)]._M_value;
                local_158._M_value._4_2_ =
                     *(undefined2 *)(pcVar3[(long)(pcVar15->_M_value + lVar11)]._M_value + 0xe);
                local_158._M_value._0_4_ =
                     *(undefined4 *)(pcVar3[(long)(pcVar15->_M_value + lVar11)]._M_value + 10);
                lVar21 = *(longdouble *)(pcVar3[(long)(pcVar15->_M_value + lVar11)]._M_value + 0x10)
                ;
                local_f8._M_value._4_2_ =
                     *(undefined2 *)(pcVar3[(long)(pcVar15->_M_value + lVar11)]._M_value + 0x1e);
                local_f8._M_value._0_4_ =
                     *(undefined4 *)(pcVar3[(long)(pcVar15->_M_value + lVar11)]._M_value + 0x1a);
                puVar13 = (undefined *)((long)pcVar15 + (1 - lVar9));
                if ((((long)pcVar15 - lVar9 < -1) ||
                    ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow
                     <= (long)puVar13)) ||
                   ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                    <= local_130)) {
                  local_170 = lVar19;
                  TPZFMatrix<std::complex<long_double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pcVar3 = (local_160->fElem).fStore[(long)pcVar15];
                pcVar14 = (complex<long_double> *)((long)pcVar3 + lVar17 + -0x20);
                local_118 = pcVar15;
                if (pcVar3 < pcVar14) {
                  pcVar12 = result->fElem +
                            (long)(puVar13 +
                                  (result->super_TPZMatrix<std::complex<long_double>_>).
                                  super_TPZBaseMatrix.fRow * local_130);
                  do {
                    uVar4 = *(undefined8 *)(pcVar14->_M_value + 8);
                    uVar5 = *(undefined8 *)(pcVar14->_M_value + 0x18);
                    local_198._M_value._16_4_ = SUB84(*(undefined8 *)(pcVar14->_M_value + 0x10),0);
                    local_198._M_value._20_4_ =
                         SUB84((ulong)*(undefined8 *)(pcVar14->_M_value + 0x10) >> 0x20,0);
                    local_198._M_value._24_2_ = SUB82(uVar5,0);
                    local_198._M_value._26_2_ = SUB82((ulong)uVar5 >> 0x10,0);
                    local_198._M_value._28_2_ = SUB82((ulong)uVar5 >> 0x20,0);
                    local_198._M_value._30_2_ = SUB82((ulong)uVar5 >> 0x30,0);
                    local_198._M_value._0_4_ = SUB84(*(undefined8 *)pcVar14->_M_value,0);
                    local_198._M_value._4_4_ =
                         SUB84((ulong)*(undefined8 *)pcVar14->_M_value >> 0x20,0);
                    local_198._M_value._8_2_ = SUB82(uVar4,0);
                    local_198._M_value._10_2_ = SUB82((ulong)uVar4 >> 0x10,0);
                    local_198._M_value._12_2_ = SUB82((ulong)uVar4 >> 0x20,0);
                    local_198._M_value._14_2_ = SUB82((ulong)uVar4 >> 0x30,0);
                    local_170 = lVar19;
                    std::complex<long_double>::operator*=(&local_198,pcVar12);
                    lVar19 = local_170 -
                             (longdouble)
                             CONCAT28(local_198._M_value._8_2_,
                                      CONCAT44(local_198._M_value._4_4_,local_198._M_value._0_4_));
                    lVar21 = lVar21 - (longdouble)
                                      CONCAT28(local_198._M_value._24_2_,
                                               CONCAT44(local_198._M_value._20_4_,
                                                        local_198._M_value._16_4_));
                    pcVar14 = pcVar14 + -1;
                    pcVar12 = pcVar12 + 1;
                    local_1b8 = lVar21;
                  } while (pcVar3 < pcVar14);
                }
                if ((((long)local_118 < 0) ||
                    ((scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow
                     <= (long)local_118)) ||
                   ((scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                    <= local_130)) {
                  local_170 = lVar19;
                  TPZFMatrix<std::complex<long_double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar17 = (scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                         fRow * local_130;
                pcVar3 = scratch->fElem;
                *(longdouble *)pcVar3[(long)(pcVar15->_M_value + lVar17)]._M_value = lVar19;
                *(undefined4 *)(pcVar3[(long)(pcVar15->_M_value + lVar17)]._M_value + 10) =
                     local_158._M_value._0_4_;
                *(undefined2 *)(pcVar3[(long)(pcVar15->_M_value + lVar17)]._M_value + 0xe) =
                     local_158._M_value._4_2_;
                *(longdouble *)(pcVar3[(long)(pcVar15->_M_value + lVar17)]._M_value + 0x10) = lVar21
                ;
                *(undefined4 *)(pcVar3[(long)(pcVar15->_M_value + lVar17)]._M_value + 0x1a) =
                     local_f8._M_value._0_4_;
                *(undefined2 *)(pcVar3[(long)(pcVar15->_M_value + lVar17)]._M_value + 0x1e) =
                     local_f8._M_value._4_2_;
                pcVar15 = (complex<long_double> *)(local_118->_M_value + local_100);
              } while (pcVar15 != local_138);
            }
            pcVar15 = local_120;
            lVar19 = in_ST1;
            lVar21 = in_ST2;
            if (local_120 != local_138) {
              do {
                in_ST1 = in_ST4;
                ppcVar2 = (local_160->fElem).fStore;
                pcVar3 = ppcVar2[(long)pcVar15];
                lVar17 = (long)ppcVar2[(long)(pcVar15->_M_value + 1)] - (long)pcVar3;
                local_1b8 = (longdouble)CONCAT28(local_1b8._8_2_,lVar17);
                pcVar14 = (complex<long_double> *)((long)pcVar15 + (1 - (lVar17 >> 5)));
                if ((((long)pcVar15 - (lVar17 >> 5) < -1) ||
                    ((scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow
                     <= (long)pcVar14)) ||
                   ((scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                    <= local_130)) {
                  TPZFMatrix<std::complex<long_double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar9 = (scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                        fRow;
                lVar11 = lVar9 * local_130;
                pcVar12 = scratch->fElem;
                local_118 = pcVar14;
                if ((((long)pcVar15 < 0) || (lVar9 <= (long)pcVar15)) ||
                   ((scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                    <= local_130)) {
                  TPZFMatrix<std::complex<long_double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar9 = (scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                        fRow * local_130;
                pcVar14 = scratch->fElem + (long)(pcVar15->_M_value + lVar9);
                uVar4 = *(undefined8 *)pcVar14->_M_value;
                uVar5 = *(undefined8 *)(pcVar14->_M_value + 8);
                puVar18 = (undefined8 *)
                          (scratch->fElem[(long)(pcVar15->_M_value + lVar9)]._M_value + 0x10);
                local_158._M_value._16_8_ = *puVar18;
                uVar6 = puVar18[1];
                local_158._M_value._24_2_ = SUB82(uVar6,0);
                local_158._M_value._26_4_ = SUB84((ulong)uVar6 >> 0x10,0);
                local_158._M_value._30_2_ = SUB82((ulong)uVar6 >> 0x30,0);
                local_158._M_value._0_4_ = SUB84(uVar4,0);
                local_158._M_value._4_2_ = SUB82((ulong)uVar4 >> 0x20,0);
                local_158._M_value._6_2_ = SUB82((ulong)uVar4 >> 0x30,0);
                local_158._M_value._8_2_ = SUB82(uVar5,0);
                local_158._M_value._10_4_ = SUB84((ulong)uVar5 >> 0x10,0);
                local_158._M_value._14_2_ = SUB82((ulong)uVar5 >> 0x30,0);
                if ((((long)pcVar15 < 0) ||
                    ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow
                     <= (long)pcVar15)) ||
                   ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                    <= local_130)) {
                  TPZFMatrix<std::complex<long_double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                uVar4 = *(undefined8 *)(pcVar3->_M_value + 8);
                uVar5 = *(undefined8 *)(pcVar3->_M_value + 0x18);
                local_198._M_value._16_4_ = SUB84(*(undefined8 *)(pcVar3->_M_value + 0x10),0);
                local_198._M_value._20_4_ =
                     SUB84((ulong)*(undefined8 *)(pcVar3->_M_value + 0x10) >> 0x20,0);
                local_198._M_value._24_2_ = SUB82(uVar5,0);
                local_198._M_value._26_2_ = SUB82((ulong)uVar5 >> 0x10,0);
                local_198._M_value._28_2_ = SUB82((ulong)uVar5 >> 0x20,0);
                local_198._M_value._30_2_ = SUB82((ulong)uVar5 >> 0x30,0);
                local_198._M_value._0_4_ = SUB84(*(undefined8 *)pcVar3->_M_value,0);
                local_198._M_value._4_4_ = SUB84((ulong)*(undefined8 *)pcVar3->_M_value >> 0x20,0);
                local_198._M_value._8_2_ = SUB82(uVar4,0);
                local_198._M_value._10_2_ = SUB82((ulong)uVar4 >> 0x10,0);
                local_198._M_value._12_2_ = SUB82((ulong)uVar4 >> 0x20,0);
                local_198._M_value._14_2_ = SUB82((ulong)uVar4 >> 0x30,0);
                std::complex<long_double>::operator*=
                          (&local_198,
                           result->fElem +
                           (long)(pcVar15->_M_value +
                                 (result->super_TPZMatrix<std::complex<long_double>_>).
                                 super_TPZBaseMatrix.fRow * local_130));
                lVar22 = (longdouble)
                         CONCAT28(local_158._M_value._8_2_,
                                  CONCAT26(local_158._M_value._6_2_,
                                           CONCAT24(local_158._M_value._4_2_,
                                                    local_158._M_value._0_4_))) -
                         (longdouble)
                         CONCAT28(local_198._M_value._8_2_,
                                  CONCAT44(local_198._M_value._4_4_,local_198._M_value._0_4_));
                lVar20 = (longdouble)CONCAT28(local_158._M_value._24_2_,local_158._M_value._16_8_) -
                         (longdouble)
                         CONCAT28(local_198._M_value._24_2_,
                                  CONCAT44(local_198._M_value._20_4_,local_198._M_value._16_4_));
                local_158._M_value._0_4_ = SUB104(lVar22,0);
                local_158._M_value._4_2_ = SUB102((unkuint10)lVar22 >> 0x20,0);
                local_158._M_value._6_2_ = SUB102((unkuint10)lVar22 >> 0x30,0);
                local_158._M_value._8_2_ = SUB102((unkuint10)lVar22 >> 0x40,0);
                local_158._M_value._16_8_ = SUB108(lVar20,0);
                local_158._M_value._24_2_ = SUB102((unkuint10)lVar20 >> 0x40,0);
                local_f8._M_value._16_8_ = local_158._M_value._16_8_;
                local_f8._M_value._24_2_ = local_158._M_value._24_2_;
                local_f8._M_value._26_6_ =
                     SUB86(CONCAT26(local_158._M_value._30_2_,
                                    CONCAT42(local_158._M_value._26_4_,local_158._M_value._24_2_))
                           >> 0x10,0);
                local_f8._M_value._8_2_ = local_158._M_value._8_2_;
                local_f8._M_value._10_6_ =
                     SUB86(CONCAT26(local_158._M_value._14_2_,
                                    CONCAT42(local_158._M_value._10_4_,local_158._M_value._8_2_)) >>
                           0x10,0);
                local_f8._M_value._0_4_ = local_158._M_value._0_4_;
                local_f8._M_value._4_2_ = local_158._M_value._4_2_;
                local_f8._M_value._6_2_ = local_158._M_value._6_2_;
                std::complex<long_double>::operator*=(&local_f8,&local_158);
                local_198._M_value._0_4_ = local_f8._M_value._0_4_;
                local_198._M_value._4_4_ =
                     SUB84(CONCAT26(local_f8._M_value._6_2_,
                                    CONCAT24(local_f8._M_value._4_2_,local_f8._M_value._0_4_)) >>
                           0x20,0);
                local_198._M_value._8_2_ = local_f8._M_value._8_2_;
                local_198._M_value._16_4_ = local_f8._M_value._16_4_;
                local_198._M_value._20_4_ = local_f8._M_value._20_4_;
                local_198._M_value._24_2_ = local_f8._M_value._24_2_;
                cabsl();
                lVar9 = local_130;
                local_198._M_value._16_4_ = local_58._M_value._16_4_;
                local_198._M_value._20_4_ = local_58._M_value._20_4_;
                local_198._M_value._24_2_ = local_58._M_value._24_2_;
                local_198._M_value._26_2_ = local_58._M_value._26_2_;
                local_198._M_value._28_2_ = local_58._M_value._28_2_;
                local_198._M_value._30_2_ = local_58._M_value._30_2_;
                local_198._M_value._0_4_ = local_58._M_value._0_4_;
                local_198._M_value._4_4_ = local_58._M_value._4_4_;
                local_198._M_value._8_2_ = local_58._M_value._8_2_;
                local_198._M_value._10_2_ = local_58._M_value._10_2_;
                local_198._M_value._12_2_ = local_58._M_value._12_2_;
                local_198._M_value._14_2_ = local_58._M_value._14_2_;
                local_170 = in_ST0;
                std::complex<long_double>::operator*=(&local_198,&local_158);
                local_f8._M_value._2_2_ = local_198._M_value._12_2_;
                local_f8._M_value._0_2_ = local_198._M_value._10_2_;
                local_f8._M_value._4_2_ = local_198._M_value._14_2_;
                local_108._2_2_ = local_198._M_value._28_2_;
                local_108._0_2_ = local_198._M_value._26_2_;
                local_104 = local_198._M_value._30_2_;
                in_ST0 = in_ST3;
                in_ST2 = in_ST1;
                in_ST3 = in_ST1;
                in_ST4 = in_ST1;
                __divxc3();
                local_70 = local_128;
                local_128 = (double)(local_170 + (longdouble)local_128);
                local_158._M_value._0_4_ = SUB104(lVar19,0);
                local_158._M_value._4_2_ = SUB102((unkuint10)lVar19 >> 0x20,0);
                local_158._M_value._6_2_ = SUB102((unkuint10)lVar19 >> 0x30,0);
                local_158._M_value._8_2_ = SUB102((unkuint10)lVar19 >> 0x40,0);
                local_158._M_value._10_4_ = local_f8._M_value._0_4_;
                local_158._M_value._14_2_ = local_f8._M_value._4_2_;
                local_158._M_value._16_8_ = SUB108(lVar21,0);
                local_158._M_value._24_2_ = SUB102((unkuint10)lVar21 >> 0x40,0);
                local_158._M_value._26_4_ = local_108;
                local_158._M_value._30_2_ = local_104;
                local_78 = local_128;
                if ((((long)pcVar15 < 0) ||
                    ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow
                     <= (long)pcVar15)) ||
                   ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                    <= lVar9)) {
                  TPZFMatrix<std::complex<long_double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar10 = (result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                         fRow * lVar9;
                pcVar14 = result->fElem;
                lVar20 = *(longdouble *)
                          (pcVar14[(long)(pcVar15->_M_value + lVar10)]._M_value + 0x10);
                *(longdouble *)pcVar14[(long)(pcVar15->_M_value + lVar10)]._M_value =
                     *(longdouble *)pcVar14[(long)(pcVar15->_M_value + lVar10)]._M_value + lVar19;
                *(longdouble *)(pcVar14[(long)(pcVar15->_M_value + lVar10)]._M_value + 0x10) =
                     lVar20 + lVar21;
                if ((((long)pcVar15 < 0) ||
                    ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow
                     <= (long)pcVar15)) ||
                   ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                    <= lVar9)) {
                  TPZFMatrix<std::complex<long_double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar9 = (result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                        fRow * lVar9;
                pcVar14 = result->fElem + (long)(pcVar15->_M_value + lVar9);
                uVar4 = *(undefined8 *)pcVar14->_M_value;
                uVar5 = *(undefined8 *)(pcVar14->_M_value + 8);
                puVar18 = (undefined8 *)
                          (result->fElem[(long)(pcVar15->_M_value + lVar9)]._M_value + 0x10);
                local_158._M_value._16_8_ = *puVar18;
                uVar6 = puVar18[1];
                local_158._M_value._24_2_ = SUB82(uVar6,0);
                local_158._M_value._26_4_ = SUB84((ulong)uVar6 >> 0x10,0);
                local_158._M_value._30_2_ = SUB82((ulong)uVar6 >> 0x30,0);
                local_158._M_value._0_4_ = SUB84(uVar4,0);
                local_158._M_value._4_2_ = SUB82((ulong)uVar4 >> 0x20,0);
                local_158._M_value._6_2_ = SUB82((ulong)uVar4 >> 0x30,0);
                local_158._M_value._8_2_ = SUB82(uVar5,0);
                local_158._M_value._10_4_ = SUB84((ulong)uVar5 >> 0x10,0);
                local_158._M_value._14_2_ = SUB82((ulong)uVar5 >> 0x30,0);
                pcVar14 = (complex<long_double> *)
                          ((long)(local_160->fElem).fStore[(long)pcVar15] + lVar17 + -0x20);
                if (pcVar3 < pcVar14) {
                  pcVar12 = pcVar12 + (long)(local_118->_M_value + lVar11);
                  do {
                    uVar4 = *(undefined8 *)(pcVar14->_M_value + 8);
                    uVar5 = *(undefined8 *)(pcVar14->_M_value + 0x18);
                    local_198._M_value._16_4_ = SUB84(*(undefined8 *)(pcVar14->_M_value + 0x10),0);
                    local_198._M_value._20_4_ =
                         SUB84((ulong)*(undefined8 *)(pcVar14->_M_value + 0x10) >> 0x20,0);
                    local_198._M_value._24_2_ = SUB82(uVar5,0);
                    local_198._M_value._26_2_ = SUB82((ulong)uVar5 >> 0x10,0);
                    local_198._M_value._28_2_ = SUB82((ulong)uVar5 >> 0x20,0);
                    local_198._M_value._30_2_ = SUB82((ulong)uVar5 >> 0x30,0);
                    local_198._M_value._0_4_ = SUB84(*(undefined8 *)pcVar14->_M_value,0);
                    local_198._M_value._4_4_ =
                         SUB84((ulong)*(undefined8 *)pcVar14->_M_value >> 0x20,0);
                    local_198._M_value._8_2_ = SUB82(uVar4,0);
                    local_198._M_value._10_2_ = SUB82((ulong)uVar4 >> 0x10,0);
                    local_198._M_value._12_2_ = SUB82((ulong)uVar4 >> 0x20,0);
                    local_198._M_value._14_2_ = SUB82((ulong)uVar4 >> 0x30,0);
                    std::complex<long_double>::operator*=(&local_198,&local_158);
                    lVar19 = *(longdouble *)(pcVar12->_M_value + 0x10);
                    *(longdouble *)pcVar12->_M_value =
                         *(longdouble *)pcVar12->_M_value -
                         (longdouble)
                         CONCAT28(local_198._M_value._8_2_,
                                  CONCAT44(local_198._M_value._4_4_,local_198._M_value._0_4_));
                    *(longdouble *)(pcVar12->_M_value + 0x10) =
                         lVar19 - (longdouble)
                                  CONCAT28(local_198._M_value._24_2_,
                                           CONCAT44(local_198._M_value._20_4_,
                                                    local_198._M_value._16_4_));
                    pcVar14 = pcVar14 + -1;
                    pcVar12 = pcVar12 + 1;
                  } while (pcVar3 < pcVar14);
                }
                pcVar15 = (complex<long_double> *)(pcVar15->_M_value + local_100);
                lVar19 = in_ST1;
                lVar21 = in_ST2;
              } while (pcVar15 != local_138);
            }
          }
          lVar17 = local_130 + 1;
          local_b0 = local_b0 + 0x20;
        } while (lVar17 != local_b8);
      }
      if (local_128 < 0.0) {
        dVar1 = sqrt(local_128);
      }
      else {
        dVar1 = SQRT(local_128);
      }
      pcVar15 = (complex<long_double> *)(local_c0->_M_value + 1);
    } while (((long)pcVar15 < *local_c8) && (*local_d8 <= dVar1 && dVar1 != *local_d8));
  }
  if (local_a8 != (TPZFMatrix<std::complex<long_double>_> *)0x0) {
    (*(local_160->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x28])(local_160,result,local_d0);
  }
  *local_c8 = (long)pcVar15;
  *local_d8 = dVar1;
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::SolveSOR(int64_t & numiterations,const TPZFMatrix<TVar> &F,
                                   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch,const REAL overrelax,
                                   REAL &tol,const int FromCurrent,const int direction)  {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	REAL res = 2.*tol+1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
    TVar over = overrelax;
	int64_t r = this->Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	if(direction == -1) {
		ifirst = r-1;
		ilast = 0;
		iinc = -1;
	}
	int64_t it;
	for(it=0; it<numiterations && res > tol; it++) {
		res = 0.;
		scratch = F;
		for(int64_t ic=0; ic<c; ic++) {
			if(direction == 1) {
				//
				// compute the upper triangular part first and put into the scractch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val;
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					int64_t lastid = diag-diaglast;
					int64_t id;
					for(id=0; id<=lastid; id++) *(scratchp+id) -= *(diag-id) * val;
					/* codeguard fix
					 while( diag >= diaglast ) *scratchp++ -= *diag-- * val;
					 */
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					res += abs(val*val);
					result(i,ic) += val*over/ (*diag);
				}
			} else {
				//
				// the direction is upward
				//
				// put the lower triangular part of the multiplication into the scratch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					//					res += val*val;
					scratch(i,ic) = val;
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					//	TVar val = scratch(i,ic);
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					//val= result(i,ic);
					TVar val = scratch(i,ic);
					val -= *diaglast * result(i,ic);
					res += abs(val*val);
					val = over * val / *diaglast;
					result(i,ic) += val;
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					while( diag > diaglast ) *scratchp++ -= *diag-- * val;
				}
			}
		}
		res = sqrt(res);
	}
	if(residual) {
		this->Residual(result,F,*residual);
	}
	numiterations = it;
	tol = res;
}